

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int archive_read_open(archive *a,void *client_data,undefined1 *client_opener,
                     archive_read_callback *client_reader,undefined1 *client_closer)

{
  int iVar1;
  archive *in_RCX;
  archive *in_RDX;
  archive *in_RDI;
  void *in_R8;
  
  archive_read_set_open_callback(in_RDX,(undefined1 *)in_RCX);
  archive_read_set_read_callback(in_RDX,(archive_read_callback *)in_RCX);
  archive_read_set_close_callback(in_RDX,(undefined1 *)in_RCX);
  archive_read_set_callback_data(in_RCX,in_R8);
  iVar1 = archive_read_open1(in_RDI);
  return iVar1;
}

Assistant:

int
archive_read_open(struct archive *a, void *client_data,
    archive_open_callback *client_opener, archive_read_callback *client_reader,
    archive_close_callback *client_closer)
{
	/* Old archive_read_open() is just a thin shell around
	 * archive_read_open1. */
	archive_read_set_open_callback(a, client_opener);
	archive_read_set_read_callback(a, client_reader);
	archive_read_set_close_callback(a, client_closer);
	archive_read_set_callback_data(a, client_data);
	return archive_read_open1(a);
}